

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

bool __thiscall ON_SubDHeap::ReturnMeshFragment(ON_SubDHeap *this,ON_SubDMeshFragment *fragment)

{
  uint uVar1;
  ON_FixedSizePool *local_70;
  ON_FixedSizePool *local_68;
  undefined1 local_50 [8];
  ON_SleepLockGuard guard;
  ON_FixedSizePoolElement *ele;
  ON_FixedSizePool *fsp;
  size_t i;
  size_t count;
  ON_SubDMeshFragment *fragment_local;
  ON_SubDHeap *this_local;
  
  if (fragment == (ON_SubDMeshFragment *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = ON_SubDMeshFragment::VertexCapacity(fragment);
    if (uVar1 == 4) {
      fsp = (ON_FixedSizePool *)0x0;
    }
    else if (uVar1 == 9) {
      fsp = (ON_FixedSizePool *)0x1;
    }
    else if (uVar1 == 0x19) {
      fsp = (ON_FixedSizePool *)0x2;
    }
    else if (uVar1 == 0x51) {
      fsp = (ON_FixedSizePool *)0x3;
    }
    else if (uVar1 == 0x121) {
      fsp = (ON_FixedSizePool *)0x4;
    }
    else if (uVar1 == 0x441) {
      fsp = (ON_FixedSizePool *)0x5;
    }
    else if (uVar1 == 0x1081) {
      fsp = (ON_FixedSizePool *)0x6;
    }
    else {
      fsp = (ON_FixedSizePool *)0x7;
    }
    if (fsp < (ON_FixedSizePool *)0x7) {
      if (fsp == (ON_FixedSizePool *)(ulong)this->m_full_fragment_display_density) {
        local_68 = &this->m_fsp_full_fragments;
      }
      else {
        if ((undefined1 *)((long)&fsp->m_first_block + 1U) ==
            (undefined1 *)(ulong)this->m_full_fragment_display_density) {
          local_70 = &this->m_fsp_part_fragments;
        }
        else {
          local_70 = &this->m_fsp_oddball_fragments;
        }
        local_68 = local_70;
      }
      guard._8_8_ = fragment;
      ON_SleepLockGuard::ON_SleepLockGuard((ON_SleepLockGuard *)local_50,local_68);
      *(undefined4 *)(guard._8_8_ + 0x14) = 0;
      *(ON_FixedSizePoolElement **)guard._8_8_ = this->m_unused_fragments[(long)fsp];
      this->m_unused_fragments[(long)fsp] = (ON_FixedSizePoolElement *)guard._8_8_;
      this_local._7_1_ = true;
      ON_SleepLockGuard::~ON_SleepLockGuard((ON_SleepLockGuard *)local_50);
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDHeap::ReturnMeshFragment(ON_SubDMeshFragment * fragment)
{
  if (nullptr == fragment)
    return false;

  const size_t count = sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]);
  size_t i;
  switch (fragment->VertexCapacity())
  {
  case 2 * 2: // 1x1 mesh quad fragment
    i = 0;
    break;
  case 3 * 3: // 2x2 mesh quad fragment
    i = 1;
    break;
  case 5 * 5: // 4x4 mesh quad fragment
    i = 2;
    break;
  case 9 * 9: // 8x8 mesh quad fragment
    i = 3;
    break;
  case 17 * 17: // 16x16 mesh quad fragment
    i = 4;
    break;
  case 33 * 33: // 32x32 mesh quad fragment
    i = 5;
    break;
  case 65 * 65: // 64x64 mesh quad fragment
    i = 6;
    break;
  default:
    i = count;
    break;
  }
  if (i >= count)
    return ON_SUBD_RETURN_ERROR(false);

  ON_FixedSizePool& fsp 
    = (i == m_full_fragment_display_density) ? m_fsp_full_fragments
    : (i+1 == m_full_fragment_display_density) ? m_fsp_part_fragments : m_fsp_oddball_fragments;

  ON_FixedSizePoolElement* ele = (ON_FixedSizePoolElement*)fragment;
  ON_SleepLockGuard guard(fsp);
  ((unsigned int*)ele)[5] = 0; // zero m_vertex_count_etc and m_vertex_capacity_etc
  ele->m_next = m_unused_fragments[i];
  m_unused_fragments[i] = ele;

  return true;
}